

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O0

set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
* dg::pta::reachableNodes(PSNode *nd)

{
  bool bVar1;
  reference ppPVar2;
  reference ppPVar3;
  set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_dg::pta::PSNode_*>,_bool> pVar4;
  PSNode *succ;
  const_iterator __end4;
  const_iterator __begin4;
  NodesVec *__range4;
  PSNode *cur;
  iterator __end3;
  iterator __begin3;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *__range3;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> new_to_process;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> to_process;
  set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
  *reachable;
  set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
  *__lhs;
  _Rb_tree_const_iterator<const_dg::pta::PSNode_*> in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  _Rb_tree_const_iterator<const_dg::pta::PSNode_*> in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  PSNode *in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_88;
  NodesVec *local_80;
  PSNode *local_78;
  PSNode **local_70;
  __normal_iterator<const_dg::pta::PSNode_**,_std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>_>
  local_68;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *local_60;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_40;
  _Base_ptr local_28;
  undefined1 local_20;
  byte local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::
  set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
  ::set((set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
         *)0x161ee0);
  pVar4 = std::
          set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
          ::insert((set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
                    *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                   (value_type *)in_stack_ffffffffffffff58._M_node);
  local_28 = (_Base_ptr)pVar4.first._M_node;
  local_20 = pVar4.second;
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::vector
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)0x161f0e);
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
             in_stack_ffffffffffffff70._M_current,(size_type)in_stack_ffffffffffffff68);
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::push_back
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
             CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
             (value_type *)in_stack_ffffffffffffff48._M_node);
  while( true ) {
    bVar1 = std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::empty
                      ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
                       CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::vector
              ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)0x161f57
              );
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::size(&local_40);
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
              ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
               in_stack_ffffffffffffff70._M_current,(size_type)in_stack_ffffffffffffff68);
    local_60 = &local_40;
    local_68._M_current =
         (PSNode **)
         std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::begin
                   ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
                    in_RDI);
    local_70 = (PSNode **)
               std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::end
                         ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                           *)in_RDI);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_dg::pta::PSNode_**,_std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>_>
                          *)__lhs,(__normal_iterator<const_dg::pta::PSNode_**,_std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>_>
                                   *)in_RDI);
      if (!bVar1) break;
      ppPVar2 = __gnu_cxx::
                __normal_iterator<const_dg::pta::PSNode_**,_std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>_>
                ::operator*(&local_68);
      local_78 = *ppPVar2;
      local_80 = SubgraphNode<dg::pta::PSNode>::successors
                           (&local_78->super_SubgraphNode<dg::pta::PSNode>);
      local_88._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)in_RDI);
      in_stack_ffffffffffffff70 =
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)in_RDI);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                            *)__lhs,(__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                     *)in_RDI);
        if (!bVar1) break;
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_88);
        in_stack_ffffffffffffff68 = *ppPVar3;
        pVar4 = std::
                set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
                ::insert((set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
                          *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                         (value_type *)in_stack_ffffffffffffff58._M_node);
        in_stack_ffffffffffffff48 = pVar4.first._M_node;
        in_stack_ffffffffffffff50 = pVar4.second;
        in_stack_ffffffffffffff58._M_node = in_stack_ffffffffffffff48._M_node;
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff50;
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::push_back
                    ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
                     CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                     (value_type *)in_stack_ffffffffffffff48._M_node);
        }
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_88);
      }
      __gnu_cxx::
      __normal_iterator<const_dg::pta::PSNode_**,_std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>_>
      ::operator++(&local_68);
    }
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::swap
              ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
               CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
               (vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
               in_stack_ffffffffffffff48._M_node);
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::~vector
              ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
               CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
  }
  local_11 = 1;
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::~vector
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
             CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50));
  if ((local_11 & 1) == 0) {
    std::
    set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
    ::~set((set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
            *)0x1620c7);
  }
  return in_RDI;
}

Assistant:

std::set<const PSNode *> reachableNodes(const PSNode *nd) {
    std::set<const PSNode *> reachable;
    reachable.insert(nd);

    std::vector<const PSNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(nd);

    while (!to_process.empty()) {
        std::vector<const PSNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (const PSNode *cur : to_process) {
            for (const PSNode *succ : cur->successors()) {
                if (reachable.insert(succ).second)
                    new_to_process.push_back(succ);
            }
        }

        new_to_process.swap(to_process);
    }

    return reachable;
}